

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_sessionwidget.cpp
# Opt level: O3

void SessionWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  QMetaTypeInterface *pQVar6;
  int iVar7;
  QArrayData *pQVar8;
  QArrayDataPointer<std::pair<QString,_QString>_> *this;
  undefined4 local_3d0;
  undefined1 local_3cc;
  void *local_3c8;
  SearchParams *local_3c0;
  QString local_3b0;
  QString local_398;
  QString local_380;
  RegExpReplacement local_368;
  QArrayDataPointer<QString> local_348;
  QArrayDataPointer<std::pair<QString,_QString>_> local_330;
  QArrayDataPointer<std::pair<QString,_QString>_> local_318;
  undefined1 local_300;
  QArrayDataPointer<ReplaceFile> local_2f8;
  undefined1 local_2e0;
  QArrayDataPointer<std::pair<QString,_QString>_> local_2d8;
  ReplacedParams local_2c0;
  RegExpPath local_2a0;
  RegExp local_268;
  SearchNameHits local_220;
  CountFilesParams local_1c0;
  SearchHits local_168;
  SearchParams local_e0;
  
  if (_c == RegisterMethodArgumentMetaType) {
    switch(_id) {
    case 0:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<SearchParams>::metaType;
        goto LAB_00122d38;
      }
      break;
    default:
      puVar5 = (undefined8 *)*_a;
      break;
    case 3:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<ReplaceParams>::metaType;
        goto LAB_00122d38;
      }
      break;
    case 4:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<CountFilesParams>::metaType;
        goto LAB_00122d38;
      }
      break;
    case 6:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<GetListingParams>::metaType;
        goto LAB_00122d38;
      }
      break;
    case 7:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<RenameParams>::metaType;
        goto LAB_00122d38;
      }
      break;
    case 8:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<ViewOptions>::metaType;
        goto LAB_00122d38;
      }
      break;
    case 0x12:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 1) {
        pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<SearchHits>::metaType;
      }
      else {
        if (*_a[1] != 2) break;
        pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<SearchNameHits>::metaType;
      }
LAB_00122d38:
      *puVar5 = pQVar6;
      return;
    case 0x17:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<RegExp>::metaType;
        goto LAB_00122d38;
      }
      break;
    case 0x18:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<RegExpPath>::metaType;
        goto LAB_00122d38;
      }
      break;
    case 0x19:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<RegExpReplacement>::metaType;
        goto LAB_00122d38;
      }
      break;
    case 0x1a:
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pQVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<ReplacedParams>::metaType;
        goto LAB_00122d38;
      }
    }
    *puVar5 = 0;
    return;
  }
  if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == search && lVar3 == 0) {
      *puVar1 = 0;
      return;
    }
    if (pcVar2 == searchMore && lVar3 == 0) {
      *puVar1 = 1;
      return;
    }
    if (pcVar2 == collect && lVar3 == 0) {
      *puVar1 = 2;
      return;
    }
    if (pcVar2 == replace && lVar3 == 0) {
      *puVar1 = 3;
      return;
    }
    if (pcVar2 == countFiles && lVar3 == 0) {
      *puVar1 = 4;
      return;
    }
    if (pcVar2 == canReplace && lVar3 == 0) {
      *puVar1 = 5;
      return;
    }
    if (pcVar2 == getListing && lVar3 == 0) {
      *puVar1 = 6;
      return;
    }
    if (pcVar2 == rename && lVar3 == 0) {
      *puVar1 = 7;
      return;
    }
    if (pcVar2 != viewOptionsChanged || lVar3 != 0) {
      return;
    }
    *puVar1 = 8;
    return;
  }
  if (_c != InvokeMetaMethod) {
    return;
  }
  switch(_id) {
  case 0:
    SearchParams::SearchParams(&local_e0,(SearchParams *)_a[1]);
    local_3c8 = (void *)0x0;
    local_3c0 = &local_e0;
    QMetaObject::activate(_o,&staticMetaObject,0,&local_3c8);
    SearchParams::~SearchParams(&local_e0);
    break;
  case 1:
    local_3d0 = *_a[1];
    iVar7 = 1;
    goto LAB_00122bdf;
  case 2:
    QMetaObject::activate(_o,&staticMetaObject,2,(void **)0x0);
    return;
  case 3:
    plVar4 = (long *)_a[1];
    local_2f8.d = (Data *)*plVar4;
    local_2f8.ptr = (ReplaceFile *)plVar4[1];
    local_2f8.size = plVar4[2];
    if (local_2f8.d != (Data *)0x0) {
      LOCK();
      ((local_2f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_2e0 = (undefined1)plVar4[3];
    local_2d8.d = (Data *)plVar4[4];
    local_2d8.ptr = (pair<QString,_QString> *)plVar4[5];
    local_2d8.size = plVar4[6];
    if (local_2d8.d != (Data *)0x0) {
      LOCK();
      ((local_2d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_3c8 = (void *)0x0;
    local_3c0 = (SearchParams *)&local_2f8;
    QMetaObject::activate(_o,&staticMetaObject,3,&local_3c8);
    QArrayDataPointer<std::pair<QString,_QString>_>::~QArrayDataPointer(&local_2d8);
    QArrayDataPointer<ReplaceFile>::~QArrayDataPointer(&local_2f8);
    break;
  case 4:
    CountFilesParams::CountFilesParams(&local_1c0,(CountFilesParams *)_a[1]);
    local_3c8 = (void *)0x0;
    local_3c0 = (SearchParams *)&local_1c0;
    QMetaObject::activate(_o,&staticMetaObject,4,&local_3c8);
    CountFilesParams::~CountFilesParams(&local_1c0);
    break;
  case 5:
    local_3d0 = *_a[1];
    iVar7 = 5;
    goto LAB_00122bdf;
  case 6:
    plVar4 = (long *)_a[1];
    local_318.d = (Data *)*plVar4;
    local_318.ptr = (pair<QString,_QString> *)plVar4[1];
    local_318.size = plVar4[2];
    if ((QArrayData *)local_318.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_318.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_318.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_300 = (undefined1)plVar4[3];
    local_3c0 = (SearchParams *)&local_318;
    local_3c8 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,6,&local_3c8);
    if (&(local_318.d)->super_QArrayData == (QArrayData *)0x0) {
      return;
    }
    LOCK();
    ((local_318.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_318.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    iVar7 = ((local_318.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    pQVar8 = &(local_318.d)->super_QArrayData;
    goto joined_r0x00122c84;
  case 7:
    plVar4 = (long *)_a[1];
    local_330.d = (Data *)*plVar4;
    local_330.ptr = (pair<QString,_QString> *)plVar4[1];
    local_330.size = plVar4[2];
    if (local_330.d != (Data *)0x0) {
      LOCK();
      ((local_330.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_330.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_3c8 = (void *)0x0;
    local_3c0 = (SearchParams *)&local_330;
    QMetaObject::activate(_o,&staticMetaObject,7,&local_3c8);
    this = &local_330;
    goto LAB_00122d13;
  case 8:
    local_3d0 = *_a[1];
    local_3cc = *(undefined1 *)((long)_a[1] + 4);
    iVar7 = 8;
LAB_00122bdf:
    local_3c0 = (SearchParams *)&local_3d0;
    local_3c8 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar7,&local_3c8);
    break;
  case 9:
    onCanceled((SessionWidget *)_o);
    return;
  case 10:
    onCountFiles((SessionWidget *)_o);
    return;
  case 0xb:
    onGetListing((SessionWidget *)_o);
    return;
  case 0xc:
    onFilesCounted((SessionWidget *)_o);
    return;
  case 0xd:
    onRenamed((SessionWidget *)_o,*_a[1],*_a[2]);
    return;
  case 0xe:
    onTabClose((SessionWidget *)_o,*_a[1]);
    return;
  case 0xf:
    onCompleterActivated((SessionWidget *)_o,*(QModelIndex *)_a[1]);
    break;
  case 0x10:
    plVar4 = (long *)_a[1];
    local_380.d.d = (Data *)*plVar4;
    local_380.d.ptr = (char16_t *)plVar4[1];
    local_380.d.size = plVar4[2];
    if ((QArrayData *)local_380.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_380.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_380.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    plVar4 = (long *)_a[2];
    local_348.d = (Data *)*plVar4;
    local_348.ptr = (QString *)plVar4[1];
    local_348.size = plVar4[2];
    if (local_348.d != (Data *)0x0) {
      LOCK();
      ((local_348.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_348.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    onListing((SessionWidget *)_o,&local_380,(QStringList *)&local_348);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_348);
    if (&(local_380.d.d)->super_QArrayData == (QArrayData *)0x0) {
      return;
    }
    LOCK();
    ((local_380.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_380.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    iVar7 = ((local_380.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    pQVar8 = &(local_380.d.d)->super_QArrayData;
    goto joined_r0x00122a3e;
  case 0x11:
    on_results_currentChanged((SessionWidget *)_o,*_a[1]);
    return;
  case 0x12:
    iVar7 = *_a[1];
    SearchHits::SearchHits(&local_168,(SearchHits *)_a[2]);
    SearchNameHits::SearchNameHits(&local_220,(SearchNameHits *)_a[3]);
    onFound((SessionWidget *)_o,iVar7,&local_168,&local_220);
    SearchNameHits::~SearchNameHits(&local_220);
    SearchHits::~SearchHits(&local_168);
    break;
  case 0x13:
    onSearch((SessionWidget *)_o);
    return;
  case 0x14:
    plVar4 = (long *)_a[1];
    local_398.d.d = (Data *)*plVar4;
    local_398.d.ptr = (char16_t *)plVar4[1];
    local_398.d.size = plVar4[2];
    if ((QArrayData *)local_398.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_398.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_398.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    onPathChanged((SessionWidget *)_o,&local_398);
    if (&(local_398.d.d)->super_QArrayData == (QArrayData *)0x0) {
      return;
    }
    LOCK();
    ((local_398.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_398.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    iVar7 = ((local_398.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    pQVar8 = &(local_398.d.d)->super_QArrayData;
joined_r0x00122a3e:
    if (iVar7 != 0) {
      return;
    }
    goto LAB_00122c8f;
  case 0x15:
    onPreview((SessionWidget *)_o);
    return;
  case 0x16:
    onReplace((SessionWidget *)_o);
    return;
  case 0x17:
    RegExp::RegExp(&local_268,(RegExp *)_a[1]);
    onPatternChanged((SessionWidget *)_o,&local_268);
    RegExp::~RegExp(&local_268);
    break;
  case 0x18:
    plVar4 = (long *)_a[1];
    local_2a0.mPatterns.d.d = (Data *)*plVar4;
    local_2a0.mPatterns.d.ptr = (QString *)plVar4[1];
    local_2a0.mPatterns.d.size = plVar4[2];
    if (local_2a0.mPatterns.d.d != (Data *)0x0) {
      LOCK();
      ((local_2a0.mPatterns.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2a0.mPatterns.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_2a0.mPatterns_.d.d = (Data *)plVar4[3];
    local_2a0.mPatterns_.d.ptr = (QRegularExpression *)plVar4[4];
    local_2a0.mPatterns_.d.size = plVar4[5];
    if (local_2a0.mPatterns_.d.d != (Data *)0x0) {
      LOCK();
      ((local_2a0.mPatterns_.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2a0.mPatterns_.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + 1;
      UNLOCK();
    }
    local_2a0._48_2_ = *(undefined2 *)(plVar4 + 6);
    onFilterChanged((SessionWidget *)_o,&local_2a0);
    QArrayDataPointer<QRegularExpression>::~QArrayDataPointer(&local_2a0.mPatterns_.d);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_2a0);
    break;
  case 0x19:
    plVar4 = (long *)_a[1];
    local_368.mPattern.d.d = (Data *)*plVar4;
    local_368.mPattern.d.ptr = (char16_t *)plVar4[1];
    local_368.mPattern.d.size = plVar4[2];
    if ((QArrayData *)local_368.mPattern.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_368.mPattern.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_368.mPattern.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
    }
    local_368._24_2_ = *(undefined2 *)(plVar4 + 3);
    onReplacementChanged((SessionWidget *)_o,&local_368);
    if (&(local_368.mPattern.d.d)->super_QArrayData == (QArrayData *)0x0) {
      return;
    }
    LOCK();
    ((local_368.mPattern.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_368.mPattern.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    iVar7 = ((local_368.mPattern.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
    ;
    UNLOCK();
    pQVar8 = &(local_368.mPattern.d.d)->super_QArrayData;
    goto joined_r0x00122c84;
  case 0x1a:
    puVar5 = (undefined8 *)_a[1];
    local_2c0._0_8_ = *puVar5;
    local_2c0.mRenames.d.d = (Data *)puVar5[1];
    local_2c0.mRenames.d.ptr = (pair<QString,_QString> *)puVar5[2];
    local_2c0.mRenames.d.size = puVar5[3];
    if (local_2c0.mRenames.d.d != (Data *)0x0) {
      LOCK();
      ((local_2c0.mRenames.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2c0.mRenames.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    this = &local_2c0.mRenames.d;
    onReplaced((SessionWidget *)_o,&local_2c0);
LAB_00122d13:
    QArrayDataPointer<std::pair<QString,_QString>_>::~QArrayDataPointer(this);
    break;
  case 0x1b:
    onCancel((SessionWidget *)_o);
    return;
  case 0x1c:
    plVar4 = (long *)_a[1];
    local_3b0.d.d = (Data *)*plVar4;
    local_3b0.d.ptr = (char16_t *)plVar4[1];
    local_3b0.d.size = plVar4[2];
    if ((QArrayData *)local_3b0.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_3b0.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_3b0.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    on_open_textChanged((SessionWidget *)_o,&local_3b0);
    if (&(local_3b0.d.d)->super_QArrayData == (QArrayData *)0x0) {
      return;
    }
    LOCK();
    ((local_3b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_3b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    iVar7 = ((local_3b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    pQVar8 = &(local_3b0.d.d)->super_QArrayData;
joined_r0x00122c84:
    if (iVar7 == 0) {
LAB_00122c8f:
      QArrayData::deallocate(pQVar8,2,8);
    }
    break;
  case 0x1d:
    onCacheFileListClicked((SessionWidget *)_o,*_a[1]);
    return;
  }
  return;
}

Assistant:

void SessionWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<SessionWidget *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->search((*reinterpret_cast< std::add_pointer_t<SearchParams>>(_a[1]))); break;
        case 1: _t->searchMore((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->collect(); break;
        case 3: _t->replace((*reinterpret_cast< std::add_pointer_t<ReplaceParams>>(_a[1]))); break;
        case 4: _t->countFiles((*reinterpret_cast< std::add_pointer_t<CountFilesParams>>(_a[1]))); break;
        case 5: _t->canReplace((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->getListing((*reinterpret_cast< std::add_pointer_t<GetListingParams>>(_a[1]))); break;
        case 7: _t->rename((*reinterpret_cast< std::add_pointer_t<RenameParams>>(_a[1]))); break;
        case 8: _t->viewOptionsChanged((*reinterpret_cast< std::add_pointer_t<ViewOptions>>(_a[1]))); break;
        case 9: _t->onCanceled(); break;
        case 10: _t->onCountFiles(); break;
        case 11: _t->onGetListing(); break;
        case 12: _t->onFilesCounted(); break;
        case 13: _t->onRenamed((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 14: _t->onTabClose((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 15: _t->onCompleterActivated((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 16: _t->onListing((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QStringList>>(_a[2]))); break;
        case 17: _t->on_results_currentChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 18: _t->onFound((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<SearchHits>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<SearchNameHits>>(_a[3]))); break;
        case 19: _t->onSearch(); break;
        case 20: _t->onPathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 21: _t->onPreview(); break;
        case 22: _t->onReplace(); break;
        case 23: _t->onPatternChanged((*reinterpret_cast< std::add_pointer_t<RegExp>>(_a[1]))); break;
        case 24: _t->onFilterChanged((*reinterpret_cast< std::add_pointer_t<RegExpPath>>(_a[1]))); break;
        case 25: _t->onReplacementChanged((*reinterpret_cast< std::add_pointer_t<RegExpReplacement>>(_a[1]))); break;
        case 26: _t->onReplaced((*reinterpret_cast< std::add_pointer_t<ReplacedParams>>(_a[1]))); break;
        case 27: _t->onCancel(); break;
        case 28: _t->on_open_textChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 29: _t->onCacheFileListClicked((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< SearchParams >(); break;
            }
            break;
        case 3:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< ReplaceParams >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< CountFilesParams >(); break;
            }
            break;
        case 6:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< GetListingParams >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< RenameParams >(); break;
            }
            break;
        case 8:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< ViewOptions >(); break;
            }
            break;
        case 18:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< SearchHits >(); break;
            case 2:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< SearchNameHits >(); break;
            }
            break;
        case 23:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< RegExp >(); break;
            }
            break;
        case 24:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< RegExpPath >(); break;
            }
            break;
        case 25:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< RegExpReplacement >(); break;
            }
            break;
        case 26:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< ReplacedParams >(); break;
            }
            break;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (SessionWidget::*)(SearchParams );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::search)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (SessionWidget::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::searchMore)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (SessionWidget::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::collect)) {
                *result = 2;
                return;
            }
        }
        {
            using _t = void (SessionWidget::*)(ReplaceParams );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::replace)) {
                *result = 3;
                return;
            }
        }
        {
            using _t = void (SessionWidget::*)(CountFilesParams );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::countFiles)) {
                *result = 4;
                return;
            }
        }
        {
            using _t = void (SessionWidget::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::canReplace)) {
                *result = 5;
                return;
            }
        }
        {
            using _t = void (SessionWidget::*)(GetListingParams );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::getListing)) {
                *result = 6;
                return;
            }
        }
        {
            using _t = void (SessionWidget::*)(RenameParams );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::rename)) {
                *result = 7;
                return;
            }
        }
        {
            using _t = void (SessionWidget::*)(ViewOptions );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&SessionWidget::viewOptionsChanged)) {
                *result = 8;
                return;
            }
        }
    }
}